

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

int amqpvalue_get_accepted(AMQP_VALUE value,ACCEPTED_HANDLE *accepted_handle)

{
  int iVar1;
  int iVar2;
  ACCEPTED_HANDLE pAVar3;
  AMQP_VALUE pAVar4;
  uint32_t list_item_count;
  uint32_t local_1c;
  
  pAVar3 = (ACCEPTED_HANDLE)malloc(8);
  if (pAVar3 == (ACCEPTED_HANDLE)0x0) {
    *accepted_handle = (ACCEPTED_HANDLE)0x0;
    iVar2 = 0x44d5;
  }
  else {
    pAVar3->composite_value = (AMQP_VALUE)0x0;
    *accepted_handle = pAVar3;
    pAVar4 = amqpvalue_get_inplace_described_value(value);
    if (pAVar4 == (AMQP_VALUE)0x0) {
      accepted_destroy(*accepted_handle);
      iVar2 = 0x44dd;
    }
    else {
      iVar1 = amqpvalue_get_list_item_count(pAVar4,&local_1c);
      iVar2 = 0x44e4;
      if (iVar1 == 0) {
        pAVar4 = amqpvalue_clone(value);
        pAVar3->composite_value = pAVar4;
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int amqpvalue_get_accepted(AMQP_VALUE value, ACCEPTED_HANDLE* accepted_handle)
{
    int result;
    ACCEPTED_INSTANCE* accepted_instance = (ACCEPTED_INSTANCE*)accepted_create_internal();
    *accepted_handle = accepted_instance;
    if (*accepted_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            accepted_destroy(*accepted_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {

                    accepted_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}